

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> __thiscall
interfaces::MakeWallet(interfaces *this,WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  long lVar1;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((wallet->super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    puVar2 = (undefined8 *)0x0;
  }
  else {
    puVar2 = (undefined8 *)operator_new(0x20);
    *puVar2 = &PTR__WalletImpl_011539f0;
    puVar2[1] = context;
    std::__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 2),
               (__shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *)wallet);
  }
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
           )(__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
             )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Wallet> MakeWallet(wallet::WalletContext& context, const std::shared_ptr<wallet::CWallet>& wallet) { return wallet ? std::make_unique<wallet::WalletImpl>(context, wallet) : nullptr; }